

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

string<unsigned_long> __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::replaceSpecialCharacters
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,string<unsigned_long> *origstr)

{
  string<unsigned_long> *psVar1;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_00;
  bool bVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  ulong uVar5;
  string<unsigned_long> *in_RDX;
  unsigned_long *extraout_RDX;
  unsigned_long *extraout_RDX_00;
  unsigned_long *extraout_RDX_01;
  unsigned_long *extraout_RDX_02;
  unsigned_long *puVar6;
  unsigned_long *extraout_RDX_03;
  unsigned_long *extraout_RDX_04;
  unsigned_long *extraout_RDX_05;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  string<unsigned_long> sVar13;
  string<unsigned_long> *newstr;
  string<unsigned_long> local_60;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *local_50;
  string<unsigned_long> *local_48;
  int local_3c;
  ulong local_38;
  
  uVar8 = 0xffffffff;
  if (0 < (long)in_RDX->used) {
    uVar4 = 0;
    do {
      if (in_RDX->array[uVar4] == 0x26) {
        uVar8 = uVar4 & 0xffffffff;
        break;
      }
      uVar4 = uVar4 + 1;
    } while ((long)in_RDX->used != uVar4);
  }
  if ((int)uVar8 == -1) {
    (this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>)._vptr_IIrrXMLReader =
         (_func_int **)0x0;
    this->TextData = (unsigned_long *)0x0;
    core::string<unsigned_long>::operator=((string<unsigned_long> *)this,in_RDX);
    puVar6 = extraout_RDX_05;
  }
  else {
    uVar4 = 0;
    (this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>)._vptr_IIrrXMLReader =
         (_func_int **)0x0;
    this->TextData = (unsigned_long *)0x100000001;
    pp_Var3 = (_func_int **)operator_new__(8);
    (this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = pp_Var3;
    *pp_Var3 = (_func_int *)0x0;
    puVar6 = extraout_RDX;
    local_50 = (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)origstr;
    local_48 = in_RDX;
    do {
      this_00 = local_50;
      iVar7 = (int)uVar8;
      if (in_RDX->used + -3 <= iVar7) break;
      local_3c = iVar7;
      local_38 = uVar4;
      if ((int)(((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)origstr)->SpecialCharacters).
               used < 1) {
        uVar12 = 0xffffffff;
      }
      else {
        lVar9 = 0;
        lVar10 = 0;
        do {
          psVar1 = (this_00->SpecialCharacters).data;
          bVar2 = equalsn(this_00,(unsigned_long *)(*(long *)((long)&psVar1->array + lVar9) + 8),
                          local_48->array + (long)iVar7 + 1,
                          *(int *)((long)&psVar1->used + lVar9) + -2);
          uVar12 = (uint)lVar10;
          if (bVar2) break;
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x10;
          uVar12 = 0xffffffff;
        } while (lVar10 < (int)(this_00->SpecialCharacters).used);
      }
      iVar7 = local_3c;
      in_RDX = local_48;
      if (uVar12 == 0xffffffff) {
        core::string<unsigned_long>::subString(&local_60,(s32)local_48,(s32)local_38);
        origstr = (string<unsigned_long> *)local_50;
        core::string<unsigned_long>::append((string<unsigned_long> *)this,&local_60);
        puVar6 = extraout_RDX_01;
        if (local_60.array != (unsigned_long *)0x0) {
          operator_delete__(local_60.array);
          puVar6 = extraout_RDX_02;
        }
        iVar11 = 1;
      }
      else {
        core::string<unsigned_long>::subString(&local_60,(s32)local_48,(s32)local_38);
        origstr = (string<unsigned_long> *)local_50;
        core::string<unsigned_long>::append((string<unsigned_long> *)this,&local_60);
        if (local_60.array != (unsigned_long *)0x0) {
          operator_delete__(local_60.array);
        }
        core::string<unsigned_long>::append
                  ((string<unsigned_long> *)this,
                   *(((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)origstr)->
                    SpecialCharacters).data[uVar12].array);
        iVar11 = (((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)origstr)->SpecialCharacters).
                 data[uVar12].used + -1;
        puVar6 = extraout_RDX_00;
      }
      uVar12 = iVar11 + iVar7;
      uVar4 = (ulong)uVar12;
      uVar8 = 0xffffffff;
      if ((int)uVar12 < in_RDX->used) {
        puVar6 = in_RDX->array;
        uVar5 = (ulong)(int)uVar12;
        do {
          if (puVar6[uVar5] == 0x26) {
            uVar8 = uVar5 & 0xffffffff;
            break;
          }
          uVar5 = uVar5 + 1;
        } while ((long)in_RDX->used != uVar5);
      }
    } while ((int)uVar8 != -1);
    if ((int)uVar4 < in_RDX->used + -2) {
      core::string<unsigned_long>::subString(&local_60,(s32)in_RDX,(int)uVar4);
      core::string<unsigned_long>::append((string<unsigned_long> *)this,&local_60);
      puVar6 = extraout_RDX_03;
      if (local_60.array != (unsigned_long *)0x0) {
        operator_delete__(local_60.array);
        puVar6 = extraout_RDX_04;
      }
    }
  }
  sVar13._8_8_ = puVar6;
  sVar13.array = (unsigned_long *)this;
  return sVar13;
}

Assistant:

core::string<char_type> replaceSpecialCharacters(
		core::string<char_type>& origstr)
	{
		int pos = origstr.findFirst(L'&');
		int oldPos = 0;

		if (pos == -1)
			return origstr;

		core::string<char_type> newstr;

		while(pos != -1 && pos < origstr.size()-2)
		{
			// check if it is one of the special characters

			int specialChar = -1;
			for (int i=0; i<(int)SpecialCharacters.size(); ++i)
			{
				const char_type* p = &origstr.c_str()[pos]+1;

				if (equalsn(&SpecialCharacters[i][1], p, SpecialCharacters[i].size()-1))
				{
					specialChar = i;
					break;
				}
			}

			if (specialChar != -1)
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos));
				newstr.append(SpecialCharacters[specialChar][0]);
				pos += SpecialCharacters[specialChar].size();
			}
			else
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos + 1));
				pos += 1;
			}

			// find next &
			oldPos = pos;
			pos = origstr.findNext(L'&', pos);		
		}

		if (oldPos < origstr.size()-1)
			newstr.append(origstr.subString(oldPos, origstr.size()-oldPos));

		return newstr;
	}